

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_cell_t::delta_complex_cell_t(delta_complex_cell_t *this,index_t _vertex,value_t _filt)

{
  initializer_list<long> __l;
  allocator<long> local_39;
  index_t local_38;
  iterator local_30;
  size_type local_28;
  value_t local_1c;
  index_t iStack_18;
  value_t _filt_local;
  index_t _vertex_local;
  delta_complex_cell_t *this_local;
  
  local_1c = _filt;
  iStack_18 = _vertex;
  _vertex_local = (index_t)this;
  std::vector<long,_std::allocator<long>_>::vector(&this->coboundary);
  std::vector<long,_std::allocator<long>_>::vector(&this->boundary);
  local_38 = iStack_18;
  local_30 = &local_38;
  local_28 = 1;
  std::allocator<long>::allocator(&local_39);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices,__l,&local_39);
  std::allocator<long>::~allocator(&local_39);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->orientation);
  this->location = iStack_18;
  this->filt = local_1c;
  this->oldest_coface = -1;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&this->neighbours);
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::unordered_map(&this->in_or_out);
  return;
}

Assistant:

delta_complex_cell_t(index_t _vertex, value_t _filt) : filt(_filt),
						oldest_coface(-1), vertices(std::vector<index_t>{_vertex}), location(_vertex) {}